

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O1

int log_map_destroy(log_map map)

{
  log_map_bucket_conflict plVar1;
  ulong uVar2;
  
  if (map != (log_map)0x0) {
    plVar1 = (map->table).data;
    if (plVar1 != (log_map_bucket_conflict)0x0) {
      free(plVar1);
    }
    if ((map->block).data != (log_map_bucket_conflict *)0x0) {
      if ((map->block).count != 0) {
        uVar2 = 0;
        do {
          plVar1 = (map->block).data[uVar2];
          if (plVar1 != (log_map_bucket_conflict)0x0) {
            free(plVar1);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < (map->block).count);
      }
      free((map->block).data);
    }
    free(map);
    return 0;
  }
  return 1;
}

Assistant:

int log_map_destroy(log_map map)
{
	if (map == NULL)
	{
		return 1;
	}

	if (map->table.data != NULL)
	{
		free(map->table.data);
	}

	if (map->block.data != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < map->block.count; ++iterator)
		{
			if (map->block.data[iterator] != NULL)
			{
				free(map->block.data[iterator]);
			}
		}

		free(map->block.data);
	}

	free(map);

	return 0;
}